

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall nvim::Nvim::async_strwidth(Nvim *this,string *text)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"nvim_strwidth",&local_39);
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_38,text);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void Nvim::async_strwidth(const std::string& text) {
    client_.async_call("nvim_strwidth", text);
}